

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

bool nivalis::util::is_identifier(char c)

{
  if ((0x19 < (byte)((c & 0xdfU) + 0xbf)) &&
     ((0x3c < (byte)((byte)c - 0x24) ||
      ((0x1800000010000009U >> ((ulong)((byte)c - 0x24 & 0xff) & 0x3f) & 1) == 0)))) {
    return c == '.' || (byte)(c - 0x30U) < 10;
  }
  return true;
}

Assistant:

constexpr bool is_identifier(char c) {
    return
        (c >= 'a' && c <= 'z') ||
        (c >= 'A' && c <= 'Z') ||
        c == '_' || c == '$' ||
        c == '\'' || c == '`' ||
        c == '@' || is_numeric(c);
}